

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quiet_result_printer_tests.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  Variable *pVVar4;
  TestEventListener *pTVar5;
  UnitTestSource *this;
  char **in_R9;
  TestEventListener *in_stack_fffffffffffffc58;
  AssertionResult iutest_ar;
  iuCodeMessage local_378;
  int argc_local;
  ReturnTypedFixed<int> local_340;
  iuStreamMessage local_1b0;
  
  argc_local = argc;
  iutest::detail::InitIrisUnitTest<char**>(&argc_local,argv);
  iuutil::ReleaseDefaultXmlGenerator();
  if (main::logger == '\0') {
    iVar2 = __cxa_guard_acquire(&main::logger);
    if (iVar2 != 0) {
      main::logger.super_iuLogger._vptr_iuLogger = (_func_int **)&PTR__TestLogger_00130a58;
      main::logger.m_log._M_dataplus._M_p = (pointer)&main::logger.m_log.field_2;
      main::logger.m_log._M_string_length = 0;
      main::logger.m_log.field_2._M_local_buf[0] = '\0';
      __cxa_atexit(TestLogger::~TestLogger,&main::logger,&__dso_handle);
      __cxa_guard_release(&main::logger);
    }
  }
  iutest::detail::iuConsole::GetLoggerInstanceVariable()::sLogger = &main::logger;
  iutest::UnitTest::instance();
  pVVar4 = iutest::TestEnv::get_vars();
  pTVar5 = iuutil::QuietResultPrinter::SetUp();
  iutest::internal::NullHelper<false>::CompareNe<iutest::TestEventListener>
            (&iutest_ar,"(listener)",pTVar5);
  bVar1 = iutest_ar.m_result;
  iVar2 = 0;
  if (iutest_ar.m_result == false) {
    memset(&local_1b0,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream(&local_1b0.m_stream);
    iutest::detail::iuStreamMessage::iuStreamMessage((iuStreamMessage *)&local_340,&local_1b0);
    local_340.ret.value = 1;
    iutest::detail::iuCodeMessage::iuCodeMessage
              (&local_378,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/quiet_result_printer_tests.cpp"
               ,0x32,iutest_ar.m_message._M_dataplus._M_p);
    local_378._44_4_ = 2;
    iVar2 = iutest::AssertionHelper::operator=((AssertionHelper *)&local_378,&local_340);
    std::__cxx11::string::~string((string *)&local_378);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_340);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream(&local_1b0.m_stream);
  }
  std::__cxx11::string::~string((string *)&iutest_ar);
  if (bVar1 != false) {
    iutest::internal::NullHelper<false>::CompareEq<iutest::TestEventListener>
              (iutest_ar.m_message._M_dataplus._M_p,in_stack_fffffffffffffc58);
    bVar1 = iutest_ar.m_result;
    if (iutest_ar.m_result == false) {
      memset(&local_1b0,0,0x188);
      iutest::iu_global_format_stringstream::iu_global_format_stringstream(&local_1b0.m_stream);
      iutest::detail::iuStreamMessage::iuStreamMessage((iuStreamMessage *)&local_340,&local_1b0);
      local_340.ret.value = 1;
      iutest::detail::iuCodeMessage::iuCodeMessage
                (&local_378,
                 "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/quiet_result_printer_tests.cpp"
                 ,0x33,iutest_ar.m_message._M_dataplus._M_p);
      local_378._44_4_ = 2;
      iVar2 = iutest::AssertionHelper::operator=((AssertionHelper *)&local_378,&local_340);
      std::__cxx11::string::~string((string *)&local_378);
      iutest::iu_global_format_stringstream::~iu_global_format_stringstream
                ((iu_global_format_stringstream *)&local_340);
      iutest::iu_global_format_stringstream::~iu_global_format_stringstream(&local_1b0.m_stream);
    }
    std::__cxx11::string::~string((string *)&iutest_ar);
    if (bVar1 != false) {
      this = iutest::UnitTestSource::GetInstance();
      iVar3 = iutest::UnitTestSource::Run(this);
      if (iVar3 == 0) {
        iVar2 = 1;
      }
      else {
        local_340.fixed.super_Message.m_stream.super_iu_stringstream._0_8_ =
             main::logger.m_log._M_dataplus._M_p;
        iuutil::StrNotInHelper::Assertion<char[13],char_const*>
                  (&iutest_ar,(StrNotInHelper *)"\"[       OK ]\"","logger.c_str()","[       OK ]",
                   (char (*) [13])&local_340,in_R9);
        bVar1 = iutest_ar.m_result;
        if (iutest_ar.m_result == false) {
          memset(&local_1b0,0,0x188);
          iutest::iu_global_format_stringstream::iu_global_format_stringstream(&local_1b0.m_stream);
          iutest::detail::iuStreamMessage::iuStreamMessage((iuStreamMessage *)&local_340,&local_1b0)
          ;
          local_340.ret.value = 1;
          iutest::detail::iuCodeMessage::iuCodeMessage
                    (&local_378,
                     "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/quiet_result_printer_tests.cpp"
                     ,0x3e,iutest_ar.m_message._M_dataplus._M_p);
          local_378._44_4_ = 2;
          iVar2 = iutest::AssertionHelper::operator=((AssertionHelper *)&local_378,&local_340);
          std::__cxx11::string::~string((string *)&local_378);
          iutest::iu_global_format_stringstream::~iu_global_format_stringstream
                    ((iu_global_format_stringstream *)&local_340);
          iutest::iu_global_format_stringstream::~iu_global_format_stringstream(&local_1b0.m_stream)
          ;
        }
        std::__cxx11::string::~string((string *)&iutest_ar);
        if (bVar1 != false) {
          local_340.fixed.super_Message.m_stream.super_iu_stringstream._0_8_ =
               main::logger.m_log._M_dataplus._M_p;
          iuutil::StrInHelper::Assertion<char[13],char_const*>
                    (&iutest_ar,(StrInHelper *)"\"[  FAILED  ]\"","logger.c_str()","[  FAILED  ]",
                     (char (*) [13])&local_340,in_R9);
          bVar1 = iutest_ar.m_result;
          if (iutest_ar.m_result == false) {
            memset(&local_1b0,0,0x188);
            iutest::iu_global_format_stringstream::iu_global_format_stringstream
                      (&local_1b0.m_stream);
            iutest::detail::iuStreamMessage::iuStreamMessage
                      ((iuStreamMessage *)&local_340,&local_1b0);
            local_340.ret.value = 1;
            iutest::detail::iuCodeMessage::iuCodeMessage
                      (&local_378,
                       "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/quiet_result_printer_tests.cpp"
                       ,0x3f,iutest_ar.m_message._M_dataplus._M_p);
            local_378._44_4_ = 2;
            iVar2 = iutest::AssertionHelper::operator=((AssertionHelper *)&local_378,&local_340);
            std::__cxx11::string::~string((string *)&local_378);
            iutest::iu_global_format_stringstream::~iu_global_format_stringstream
                      ((iu_global_format_stringstream *)&local_340);
            iutest::iu_global_format_stringstream::~iu_global_format_stringstream
                      (&local_1b0.m_stream);
          }
          std::__cxx11::string::~string((string *)&iutest_ar);
          if (bVar1 != false) {
            pTVar5 = iutest::TestEventListeners::Release(&pVVar4->m_event_listeners,pTVar5);
            if (pTVar5 != (TestEventListener *)0x0) {
              (*pTVar5->_vptr_TestEventListener[1])(pTVar5);
            }
            iuutil::QuietResultPrinter::SetUp();
            iutest::internal::NullHelper<false>::CompareEq<iutest::TestEventListener>
                      (iutest_ar.m_message._M_dataplus._M_p,in_stack_fffffffffffffc58);
            if (iutest_ar.m_result == false) {
              memset(&local_1b0,0,0x188);
              iutest::iu_global_format_stringstream::iu_global_format_stringstream
                        (&local_1b0.m_stream);
              iutest::detail::iuStreamMessage::iuStreamMessage
                        ((iuStreamMessage *)&local_340,&local_1b0);
              local_340.ret.value = 1;
              iutest::detail::iuCodeMessage::iuCodeMessage
                        (&local_378,
                         "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/quiet_result_printer_tests.cpp"
                         ,0x46,iutest_ar.m_message._M_dataplus._M_p);
              local_378._44_4_ = 2;
              iVar2 = iutest::AssertionHelper::operator=((AssertionHelper *)&local_378,&local_340);
              std::__cxx11::string::~string((string *)&local_378);
              iutest::iu_global_format_stringstream::~iu_global_format_stringstream
                        ((iu_global_format_stringstream *)&local_340);
              iutest::iu_global_format_stringstream::~iu_global_format_stringstream
                        (&local_1b0.m_stream);
            }
            std::__cxx11::string::~string((string *)&iutest_ar);
            if (iutest_ar.m_result != false) {
              puts("*** Successful ***");
              iVar2 = 0;
            }
          }
        }
      }
    }
  }
  return iVar2;
}

Assistant:

int main(int argc, char* argv[])
#endif
{
    IUTEST_INIT(&argc, argv);
#if defined(DISABLE_FALSE_POSITIVE_XML)
    // 実行対象テストがないので xml 出力しない
    ::iuutil::ReleaseDefaultXmlGenerator();
#endif

#if !defined(IUTEST_USE_GTEST)
    static TestLogger logger;
    ::iutest::detail::iuConsole::SetLogger(&logger);
#endif

    ::iutest::TestEventListeners& listeners = ::iutest::UnitTest::GetInstance()->listeners();
    ::iutest::TestEventListener* listener = ::iuutil::QuietResultPrinter::SetUp();
#if IUTEST_HAS_ASSERTION_RETURN
    IUTEST_ASSERT_NOTNULL( listener ) << ::iutest::AssertionReturn<int>(1);
    IUTEST_ASSERT_NULL( listeners.default_result_printer() ) << ::iutest::AssertionReturn<int>(1);
#else
    IUTEST_TERMINATE_ON_FAILURE(listener != NULL);
    IUTEST_TERMINATE_ON_FAILURE(listeners.default_result_printer() == NULL);
#endif

    if( IUTEST_RUN_ALL_TESTS() == 0 )
    {
        return 1;
    }
#if !defined(IUTEST_USE_GTEST) && IUTEST_HAS_ASSERTION_RETURN
    IUTEST_ASSERT_STRNOTIN("[       OK ]", logger.c_str()) << ::iutest::AssertionReturn<int>(1);
    IUTEST_ASSERT_STRIN   ("[  FAILED  ]", logger.c_str()) << ::iutest::AssertionReturn<int>(1);
#endif


    delete listeners.Release(listener);
    listener = ::iuutil::QuietResultPrinter::SetUp();
#if IUTEST_HAS_ASSERTION_RETURN
    IUTEST_ASSERT_NULL( listener ) << ::iutest::AssertionReturn<int>(1);
#else
    if( listener != NULL )
    {
        return 1;
    }
#endif

    printf("*** Successful ***\n");
    return 0;
}